

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32_t field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int local_44;
  Limit local_40;
  int value;
  Limit limit;
  uint32_t length;
  RepeatedField<int> *values_local;
  UnknownFieldSet *unknown_fields_local;
  _func_bool_int *is_valid_local;
  CodedInputStream *pCStack_18;
  uint32_t field_number_local;
  CodedInputStream *input_local;
  
  _limit = values;
  values_local = (RepeatedField<int> *)unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)is_valid;
  is_valid_local._4_4_ = field_number;
  pCStack_18 = input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)&value);
  if (bVar1) {
    local_40 = io::CodedInputStream::PushLimit(pCStack_18,value);
    while (iVar2 = io::CodedInputStream::BytesUntilLimit(pCStack_18), 0 < iVar2) {
      bVar1 = WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (pCStack_18,&local_44);
      if (!bVar1) {
        return false;
      }
      if ((unknown_fields_local == (UnknownFieldSet *)0x0) ||
         (uVar3 = (*(code *)unknown_fields_local)(local_44), (uVar3 & 1) != 0)) {
        RepeatedField<int>::Add(_limit,local_44);
      }
      else {
        UnknownFieldSet::AddVarint
                  ((UnknownFieldSet *)values_local,is_valid_local._4_4_,(long)local_44);
      }
    }
    io::CodedInputStream::PopLimit(pCStack_18,local_40);
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32_t field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
            input, &value)) {
      return false;
    }
    if (is_valid == nullptr || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}